

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveObjectsWriter.cpp
# Opt level: O3

void __thiscall PrimitiveObjectsWriter::WriteKeyword(PrimitiveObjectsWriter *this,string *inKeyword)

{
  IByteWriter *pIVar1;
  
  pIVar1 = this->mStreamForWriting;
  if (pIVar1 != (IByteWriter *)0x0) {
    (*pIVar1->_vptr_IByteWriter[2])
              (pIVar1,(inKeyword->_M_dataplus)._M_p,inKeyword->_M_string_length);
    pIVar1 = this->mStreamForWriting;
    if (pIVar1 != (IByteWriter *)0x0) {
      (*pIVar1->_vptr_IByteWriter[2])(pIVar1,"\r\n",2);
      return;
    }
  }
  return;
}

Assistant:

void PrimitiveObjectsWriter::WriteKeyword(const std::string& inKeyword)
{
	if(!mStreamForWriting)
		return;
	mStreamForWriting->Write((const IOBasicTypes::Byte *)inKeyword.c_str(),inKeyword.size());
	EndLine();
}